

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid_casts.cpp
# Opt level: O1

BoundCastInfo *
duckdb::DefaultCasts::UUIDCastSwitch
          (BoundCastInfo *__return_storage_ptr__,BindCastInput *input,LogicalType *source,
          LogicalType *target)

{
  pointer *__ptr;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_18;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_10;
  
  if (target->id_ == VARCHAR) {
    local_10._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,
               VectorCastHelpers::StringCast<duckdb::hugeint_t,duckdb::CastFromUUID>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_10,(init_cast_local_state_t)0x0);
    if (local_10._M_head_impl != (BoundCastData *)0x0) {
      (*(local_10._M_head_impl)->_vptr_BoundCastData[1])();
    }
  }
  else {
    local_18._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,TryVectorNullCast,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_18,(init_cast_local_state_t)0x0);
    if (local_18._M_head_impl != (BoundCastData *)0x0) {
      (*(local_18._M_head_impl)->_vptr_BoundCastData[1])();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BoundCastInfo DefaultCasts::UUIDCastSwitch(BindCastInput &input, const LogicalType &source, const LogicalType &target) {
	// now switch on the result type
	switch (target.id()) {
	case LogicalTypeId::VARCHAR:
		// uuid to varchar
		return BoundCastInfo(&VectorCastHelpers::StringCast<hugeint_t, duckdb::CastFromUUID>);
	default:
		return TryVectorNullCast;
	}
}